

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string source;
  allocator<char> local_32a;
  allocator<char> local_329;
  ulong local_328;
  allocator<char> local_31b;
  allocator<char> local_31a;
  allocator<char> local_319;
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL> *local_318;
  string *local_310;
  string *local_308;
  string *local_300;
  string invalid_uniform_block_shader_source;
  string invalid_buffer_shader_source;
  string output_block_shader_source [6];
  string input_block_shader_source [3];
  string invalid_output_shader_source [6];
  string invalid_input_shader_source [5];
  
  local_318 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_buffer_shader_source,
             "layout(std140) buffer MyBuffer\n{\n    float f;\n    int   i;\n    uint  ui;\n} myBuffers[2][2];\n\nvoid main()\n{\n"
             ,(allocator<char> *)invalid_output_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_input_shader_source,"in  float input_variable",
             (allocator<char> *)invalid_output_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 1),"[2][2];\nout float output_variable",
             (allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 2),";\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)input_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 3)," = input_variable",
             (allocator<char> *)&invalid_uniform_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 4),"[0][0];\n",(allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_output_shader_source,"out float output_variable",
             (allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 1),
             "[2][2];\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)input_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 2),"[0][0] = 0.0;\n    output_variable",
             (allocator<char> *)&invalid_uniform_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 3),"[0][1] = 1.0;\n    output_variable",
             (allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 4),"[1][0] = 2.0;\n    output_variable",
             &local_32a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 5),"[1][1] = 3.0;\n",&local_329);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_uniform_block_shader_source,
             "layout(std140) uniform MyUniformBlock\n{\n    float f;\n    int   i;\n    uint  ui;\n} myUniformBlocks[2][2];\n\nvoid main()\n{\n"
             ,(allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)input_block_shader_source,
             "in  InBlock {\n    float input_variable;\n} in_block",
             (allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source + 1),
             "[2][2];\nout float output_variable;\n\nvoid main()\n{\n    output_variable = in_block"
             ,(allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source + 2),"[0][0].input_variable;\n",&local_32a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)output_block_shader_source,
             "out OutBlock {\n    float output_variable;\n} out_block",(allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source + 1),"[2][2];\n\nvoid main()\n{\n    out_block",
             &local_32a);
  local_300 = output_block_shader_source + 2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300,"[0][0].output_variable = 0.0;\n    out_block",&local_329);
  local_308 = output_block_shader_source + 3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,"[0][1].output_variable = 1.0;\n    out_block",&local_319);
  local_310 = output_block_shader_source + 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_310,"[1][0].output_variable = 2.0;\n    out_block",&local_31a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source + 5),"[1][1].output_variable = 3.0;\n",&local_31b
            );
  std::__cxx11::string::string((string *)&source,(string *)&invalid_buffer_shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e99);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_328 = (ulong)tested_shader_type;
  switch(local_328) {
  default:
    goto switchD_00ba067d_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&source);
    goto switchD_00ba067d_caseD_0;
  case 3:
    break;
  case 4:
  }
  std::__cxx11::string::append((string *)&source);
switchD_00ba067d_caseD_0:
  std::__cxx11::string::append((string *)&source);
  (*(code *)(&DAT_01722ee4 + *(int *)(&DAT_01722ee4 + local_328 * 4)))
            (&DAT_01722ee4 + *(int *)(&DAT_01722ee4 + local_328 * 4),
             default_vertex_shader_source_abi_cxx11_,default_tc_shader_source_abi_cxx11_,
             default_te_shader_source_abi_cxx11_,default_geometry_shader_source_abi_cxx11_,
             default_fragment_shader_source_abi_cxx11_);
  return;
}

Assistant:

void InteractionInterfaceArrays<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	/* Shader source with invalid buffer (buffer cannot be of arrays of arrays type). */
	const std::string invalid_buffer_shader_source = "layout(std140) buffer MyBuffer\n"
													 "{\n"
													 "    float f;\n"
													 "    int   i;\n"
													 "    uint  ui;\n"
													 "} myBuffers[2][2];\n\n"
													 "void main()\n"
													 "{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string invalid_input_shader_source[] = { "in  float input_variable", "[2][2];\n"
																					"out float output_variable",
														";\n\n"
														"void main()\n"
														"{\n"
														"    output_variable",
														" = input_variable", "[0][0];\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string invalid_output_shader_source[] = { "out float output_variable", "[2][2];\n\n"
																					  "void main()\n"
																					  "{\n"
																					  "    output_variable",
														 "[0][0] = 0.0;\n"
														 "    output_variable",
														 "[0][1] = 1.0;\n"
														 "    output_variable",
														 "[1][0] = 2.0;\n"
														 "    output_variable",
														 "[1][1] = 3.0;\n" };
	/* Shader source with invalid uniform block (uniform block cannot be of arrays of arrays type). */
	const std::string invalid_uniform_block_shader_source = "layout(std140) uniform MyUniformBlock\n"
															"{\n"
															"    float f;\n"
															"    int   i;\n"
															"    uint  ui;\n"
															"} myUniformBlocks[2][2];\n\n"
															"void main()\n"
															"{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string input_block_shader_source[] = { "in  InBlock {\n"
													  "    float input_variable;\n"
													  "} in_block",

													  "[2][2];\n"
													  "out float output_variable;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    output_variable = in_block",
													  "[0][0].input_variable;\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string output_block_shader_source[] = { "out OutBlock {\n"
													   "    float output_variable;\n"
													   "} out_block",
													   "[2][2];\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    out_block",
													   "[0][0].output_variable = 0.0;\n"
													   "    out_block",
													   "[0][1].output_variable = 1.0;\n"
													   "    out_block",
													   "[1][0].output_variable = 2.0;\n"
													   "    out_block",
													   "[1][1].output_variable = 3.0;\n" };

	/* Verify that buffer arrays of arrays type is rejected. */
	{
		std::string source = invalid_buffer_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that INPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_input_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += invalid_input_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_input_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[3];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[4];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that OUTPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_output_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_output_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that uniform block arrays of arrays type is rejected. */
	{
		std::string source = invalid_uniform_block_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of input blocks are accepted */
	if ((TestCaseBase<API>::VERTEX_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source += input_block_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += input_block_shader_source[1];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		source += input_block_shader_source[2];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of output blocks are accepted */
	if ((TestCaseBase<API>::FRAGMENT_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source = output_block_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += output_block_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}
}